

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Request.cpp
# Opt level: O3

void __thiscall Request::Request(Request *this,istream *stream)

{
  istream *piVar1;
  string tmp;
  
  (this->method)._M_dataplus._M_p = (pointer)&(this->method).field_2;
  (this->method)._M_string_length = 0;
  (this->method).field_2._M_local_buf[0] = '\0';
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  (this->protocol)._M_dataplus._M_p = (pointer)&(this->protocol).field_2;
  (this->protocol)._M_string_length = 0;
  (this->protocol).field_2._M_local_buf[0] = '\0';
  (this->host)._M_dataplus._M_p = (pointer)&(this->host).field_2;
  (this->host)._M_string_length = 0;
  (this->host).field_2._M_local_buf[0] = '\0';
  piVar1 = std::operator>>(stream,(string *)this);
  piVar1 = std::operator>>(piVar1,(string *)&this->path);
  piVar1 = std::operator>>(piVar1,(string *)&this->protocol);
  piVar1 = std::operator>>(piVar1,(string *)&this->host);
  std::operator>>(piVar1,(string *)&this->host);
  return;
}

Assistant:

Request::Request(std::istream& stream) {
    std::string tmp;
    stream >> method >> path >> protocol >> host >> host;
}